

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O3

void aom_fft2x2_float_c(float *input,float *temp,float *output)

{
  float fVar1;
  float fVar2;
  int y;
  long lVar3;
  long lVar4;
  float *pfVar5;
  
  fVar1 = *input;
  fVar2 = input[2];
  *output = fVar1 + fVar2;
  output[2] = fVar1 - fVar2;
  fVar1 = input[1];
  fVar2 = input[3];
  output[1] = fVar1 + fVar2;
  output[3] = fVar1 - fVar2;
  lVar3 = 0;
  do {
    temp[lVar3 * 2] = output[lVar3];
    temp[lVar3 * 2 + 1] = output[lVar3 + 2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 2);
  fVar1 = *temp;
  fVar2 = temp[2];
  *output = fVar1 + fVar2;
  output[2] = fVar1 - fVar2;
  fVar1 = temp[1];
  fVar2 = temp[3];
  output[1] = fVar1 + fVar2;
  output[3] = fVar1 - fVar2;
  lVar3 = 0;
  do {
    temp[lVar3 * 2] = output[lVar3];
    temp[lVar3 * 2 + 1] = output[lVar3 + 2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 2);
  pfVar5 = output + 1;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      pfVar5[lVar4 * 2 + -1] = temp[lVar4];
      pfVar5[lVar4 * 2] = 0.0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
    lVar3 = lVar3 + 1;
    pfVar5 = pfVar5 + 4;
    temp = temp + 2;
  } while (lVar3 != 2);
  return;
}

Assistant:

void aom_fft2x2_float_c(const float *input, float *temp, float *output) {
  aom_fft_2d_gen(input, temp, output, 2, aom_fft1d_2_float, simple_transpose,
                 unpack_2d_output, 1);
}